

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::IfcLShapeProfileDef(IfcLShapeProfileDef *this)

{
  IfcLShapeProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xf0,"IfcLShapeProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__00f70050);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLShapeProfileDef,_8UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLShapeProfileDef,_8UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__00f70098);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf6ffc0;
  *(undefined8 *)&this->field_0xf0 = 0xf70038;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0xf6ffe8
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0xf70010;
  STEP::Maybe<double>::Maybe(&this->Width);
  STEP::Maybe<double>::Maybe(&this->FilletRadius);
  STEP::Maybe<double>::Maybe(&this->EdgeRadius);
  STEP::Maybe<double>::Maybe(&this->LegSlope);
  STEP::Maybe<double>::Maybe(&this->CentreOfGravityInX);
  STEP::Maybe<double>::Maybe(&this->CentreOfGravityInY);
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}